

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O2

void __thiscall
Fl_Check_Browser::item_draw(Fl_Check_Browser *this,void *v,int X,int Y,int param_4,int param_5)

{
  uint uVar1;
  char *str;
  int iVar2;
  int iVar3;
  Fl_Color FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  Fl_Color local_74;
  
  str = *(char **)((long)v + 0x18);
  uVar1 = (this->super_Fl_Browser_).textsize_;
  iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
  local_74 = (this->super_Fl_Browser_).textcolor_;
  if (iVar2 == 0) {
    local_74 = fl_inactive(local_74);
  }
  iVar2 = (int)((uVar1 - (this->super_Fl_Browser_).textsize_) + 3) / 2;
  uVar10 = iVar2 + Y;
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  uVar8 = 0;
  if (iVar3 == 0) {
    FVar4 = fl_inactive(0);
    uVar8 = (ulong)FVar4;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar8);
  iVar3 = (this->super_Fl_Browser_).textsize_;
  uVar8 = (ulong)((uVar10 + iVar3) - 2);
  uVar9 = (ulong)(uint)(iVar3 + X);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x15])
            (fl_graphics_driver,(ulong)(X + 2U),(ulong)uVar10,(ulong)(X + 2U),uVar8,uVar9,uVar8,
             uVar9,(ulong)uVar10);
  if (*(char *)((long)v + 0x10) != '\0') {
    iVar3 = (this->super_Fl_Browser_).textsize_;
    iVar7 = 3;
    iVar5 = (iVar3 + -6) / 3;
    iVar6 = (iVar3 + ((iVar3 + -6) - iVar5) + -2) / 2;
    uVar10 = ((uVar10 - 2) - iVar5) + iVar6;
    uVar13 = iVar5 + X + 5;
    iVar2 = iVar2 + iVar6;
    uVar12 = ((iVar5 + Y + iVar2) - iVar3) + 5;
    uVar11 = (Y + iVar2) - 2;
    while (bVar14 = iVar7 != 0, iVar7 = iVar7 + -1, bVar14) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                (fl_graphics_driver,(ulong)(X + 5),(ulong)uVar10,(ulong)uVar13,(ulong)uVar11);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                (fl_graphics_driver,(ulong)uVar13,(ulong)uVar11,(ulong)((X + iVar3) - 2),
                 (ulong)uVar12);
      uVar10 = uVar10 + 1;
      uVar12 = uVar12 + 1;
      uVar11 = uVar11 + 1;
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Browser_).textfont_,(ulong)uVar1);
  if (*(char *)((long)v + 0x11) != '\0') {
    local_74 = fl_contrast(local_74,(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.color2_
                          );
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)local_74)
  ;
  fl_draw(str,X + (this->super_Fl_Browser_).textsize_ + 8,Y + uVar1 + -1);
  return;
}

Assistant:

void Fl_Check_Browser::item_draw(void *v, int X, int Y, int, int) const {
	cb_item *i = (cb_item *)v;
	char *s = i->text;
	int tsize = textsize();
	Fl_Color col = active_r() ? textcolor() : fl_inactive(textcolor());
	int cy = Y + (tsize + 1 - CHECK_SIZE) / 2;
	X += 2;

	fl_color(active_r() ? FL_FOREGROUND_COLOR : fl_inactive(FL_FOREGROUND_COLOR));
	fl_loop(X, cy, X, cy + CHECK_SIZE,
	        X + CHECK_SIZE, cy + CHECK_SIZE, X + CHECK_SIZE, cy);
	if (i->checked) {
	  int tx = X + 3;
	  int tw = CHECK_SIZE - 4;
	  int d1 = tw/3;
	  int d2 = tw-d1;
	  int ty = cy + (CHECK_SIZE+d2)/2-d1-2;
	  for (int n = 0; n < 3; n++, ty++) {
	    fl_line(tx, ty, tx+d1, ty+d1);
	    fl_line(tx+d1, ty+d1, tx+tw-1, ty+d1-d2+1);
	  }
	}
	fl_font(textfont(), tsize);
	if (i->selected) {
		col = fl_contrast(col, selection_color());
	}
	fl_color(col);
	fl_draw(s, X + CHECK_SIZE + 8, Y + tsize - 1);
}